

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

XXH64_hash_t XXH_INLINE_XXH64(void *input,size_t len,XXH64_hash_t seed)

{
  xxh_u64 xVar1;
  ulong in_RCX;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  
  if (len < 0x20) {
    lVar10 = 0x27d4eb2f165667c5;
  }
  else {
    plVar9 = (long *)((long)input + (len - 0x1f));
    uVar8 = 0x61c8864e7a143579;
    lVar10 = 0x60ea27eeadc0b5d6;
    uVar2 = 0;
    uVar3 = 0xc2b2ae3d27d4eb4f;
    do {
      uVar6 = *input * -0x3d4d51c2d82b14b1 + lVar10;
      uVar7 = uVar6 * 0x80000000 | uVar6 >> 0x21;
      lVar10 = uVar7 * -0x61c8864e7a143579;
      uVar3 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + uVar3;
      uVar5 = uVar3 * 0x80000000 | uVar3 >> 0x21;
      uVar2 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + uVar2;
      uVar6 = uVar2 * 0x80000000 | uVar2 >> 0x21;
      uVar3 = uVar5 * -0x61c8864e7a143579;
      uVar2 = uVar6 * -0x61c8864e7a143579;
      uVar8 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + uVar8;
      uVar4 = uVar8 * 0x80000000 | uVar8 >> 0x21;
      uVar8 = uVar4 * -0x61c8864e7a143579;
      input = (void *)((long)input + 0x20);
    } while (input < plVar9);
    in_RCX = ((uVar6 * -0x784349ab80000000 | uVar6 * -0x210ca4fef0869357 >> 0x21) *
              -0x61c8864e7a143579 ^
             ((uVar5 * -0x784349ab80000000 | uVar5 * -0x210ca4fef0869357 >> 0x21) *
              -0x61c8864e7a143579 ^
             ((uVar7 * -0x784349ab80000000 | uVar7 * -0x210ca4fef0869357 >> 0x21) *
              -0x61c8864e7a143579 ^
             (uVar4 * -0x1939e850d5e40000 | uVar8 >> 0x2e) +
             (uVar6 * 0x779b185ebca87000 | uVar2 >> 0x34) +
             (uVar5 * 0x1bbcd8c2f5e54380 | uVar3 >> 0x39) +
             (uVar7 * 0x3c6ef3630bd7950e | (ulong)(lVar10 < 0))) * -0x61c8864e7a143579 +
             0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
             0x85ebca77c2b2ae63;
    lVar10 = ((uVar4 * -0x784349ab80000000 | uVar4 * -0x210ca4fef0869357 >> 0x21) *
              -0x61c8864e7a143579 ^ in_RCX) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  xVar1 = XXH64_finalize(lVar10 + len,(xxh_u8 *)input,len,(XXH_alignment)in_RCX);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH64 (const void* input, size_t len, XXH64_hash_t seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH64_state_t state;
    XXH64_reset(&state, seed);
    XXH64_update(&state, (const xxh_u8*)input, len);
    return XXH64_digest(&state);
#else
    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 7)==0) {  /* Input is aligned, let's leverage the speed advantage */
            return XXH64_endian_align((const xxh_u8*)input, len, seed, XXH_aligned);
    }   }

    return XXH64_endian_align((const xxh_u8*)input, len, seed, XXH_unaligned);

#endif
}